

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int uv_signal_init(uv_loop_t *loop,uv_signal_t *handle)

{
  long *plVar1;
  int iVar2;
  
  if (loop->signal_pipefd[0] == -1) {
    iVar2 = uv__make_pipe(loop->signal_pipefd,0x800);
    if (iVar2 != 0) {
      return iVar2;
    }
    uv__io_init(&loop->signal_io_watcher,uv__signal_event,loop->signal_pipefd[0]);
    uv__io_start(loop,&loop->signal_io_watcher,1);
  }
  handle->loop = loop;
  handle->type = UV_SIGNAL;
  handle->flags = 0x2000;
  handle->handle_queue[0] = loop->handle_queue;
  plVar1 = (long *)loop->handle_queue[1];
  handle->handle_queue[1] = plVar1;
  *plVar1 = (long)handle->handle_queue;
  loop->handle_queue[1] = handle->handle_queue;
  handle->next_closing = (uv_handle_t *)0x0;
  handle->signum = 0;
  handle->caught_signals = 0;
  handle->dispatched_signals = 0;
  return 0;
}

Assistant:

int uv_signal_init(uv_loop_t* loop, uv_signal_t* handle) {
  int err;

  err = uv__signal_loop_once_init(loop);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*) handle, UV_SIGNAL);
  handle->signum = 0;
  handle->caught_signals = 0;
  handle->dispatched_signals = 0;

  return 0;
}